

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,unsigned_short>
          (TryCast *this,string_t input,uint16_t *result,bool strict)

{
  idx_t pos;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  short sVar6;
  ulong uVar7;
  ushort uVar8;
  byte bVar9;
  char cVar10;
  long lVar11;
  uint uVar12;
  byte bVar14;
  char *pcVar15;
  ulong uVar16;
  idx_t iVar17;
  bool bVar18;
  ExponentData exponent;
  byte local_88;
  IntegerDecimalCastData<unsigned_short> local_78;
  ushort *local_58;
  ulong local_50;
  ulong local_48;
  string_t input_local;
  ulong uVar13;
  
  local_58 = input.value._8_8_;
  input_local.value.pointer.ptr = input.value._0_8_;
  pcVar15 = input.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar15 = input_local.value.pointer.prefix;
  }
  uVar5 = (ulong)this & 0xffffffff;
  uVar16 = 0;
  while( true ) {
    uVar7 = uVar5 - uVar16;
    local_88 = (byte)result;
    input_local.value._0_8_ = this;
    if (uVar7 == 0) break;
    bVar14 = pcVar15[uVar16];
    if ((4 < bVar14 - 9) && (bVar14 != 0x20)) {
      if (bVar14 == 0x2d) {
        uVar1 = uVar5 - uVar16;
        uVar7 = 1;
        goto LAB_0024365b;
      }
      if ((uVar5 - 1 == uVar16) || (bVar14 != 0x30)) {
        if ((local_88 & bVar14 == 0x2b) == 0) {
          uVar12 = (uint)(bVar14 == 0x2b);
LAB_00243877:
          uVar13 = (ulong)uVar12;
          uVar8 = 0;
          uVar1 = uVar13;
          goto LAB_00243888;
        }
        break;
      }
      cVar10 = pcVar15[uVar16 + 1];
      if (cVar10 == 'B') {
LAB_00243968:
        uVar7 = ~uVar16 + uVar5;
        uVar13 = 1;
        uVar8 = 0;
        goto LAB_00243977;
      }
      if (cVar10 != 'x') {
        if (cVar10 == 'b') goto LAB_00243968;
        if (cVar10 != 'X') {
          if ((local_88 & (byte)(cVar10 - 0x30U) < 10) == 0) {
            uVar12 = 0;
            goto LAB_00243877;
          }
          break;
        }
      }
      local_50 = ~uVar16 + uVar5;
      uVar8 = 0;
      uVar13 = 1;
      goto LAB_002436d2;
    }
    uVar16 = uVar16 + 1;
  }
  goto LAB_00243b39;
LAB_002437d7:
  uVar13 = uVar7;
  if (uVar1 <= uVar13) goto joined_r0x00243b20;
  bVar14 = pcVar15[uVar16 + uVar13];
  if (9 < (byte)(bVar14 - 0x30)) {
    if (bVar14 == 0x2e) {
      if (local_88 != 0) goto LAB_00243b39;
      if (uVar1 <= uVar13 + 1) goto joined_r0x00243b20;
      if ((uVar13 < 2) ||
         (bVar14 = pcVar15[uVar16 + 1 + uVar13], uVar13 = uVar13 + 1, (byte)(bVar14 - 0x30) < 10))
      goto LAB_00243b39;
    }
    if ((bVar14 < 0x21) && ((0x100003e00U >> ((ulong)bVar14 & 0x3f) & 1) != 0)) {
      uVar7 = uVar13 + 1;
      uVar13 = uVar7;
      if (uVar7 < uVar1) {
        uVar13 = uVar1;
      }
      goto LAB_00243a82;
    }
    goto LAB_00243b39;
  }
  uVar8 = uVar8 * 10 - (ushort)(byte)(bVar14 - 0x30);
  uVar7 = uVar1;
  if (((~uVar13 + uVar5 != uVar16) &&
      (uVar7 = uVar13 + 1, pcVar15[uVar16 + 1 + uVar13] == '_' && local_88 == 0)) &&
     (((uVar5 - uVar13) - 2 == uVar16 ||
      (uVar7 = uVar13 + 2, 9 < (byte)(pcVar15[uVar16 + 2 + uVar13] - 0x30U))))) goto LAB_00243b39;
  goto LAB_002437d7;
LAB_00243a82:
  if (uVar1 <= uVar7) goto joined_r0x00243b20;
  if ((0x20 < (ulong)(byte)pcVar15[uVar16 + uVar7]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar16 + uVar7] & 0x3f) & 1) == 0)) goto LAB_00243b39;
  uVar7 = uVar7 + 1;
  goto LAB_00243a82;
LAB_00243977:
  if (uVar7 <= uVar13) goto joined_r0x00243b20;
  if (pcVar15[uVar16 + 1 + uVar13] == '0') {
    sVar6 = 0;
  }
  else {
    if (pcVar15[uVar16 + 1 + uVar13] != '1') goto LAB_00243b39;
    sVar6 = 1;
  }
  uVar1 = uVar7;
  if ((uVar5 - uVar13) - 2 != uVar16) {
    if (pcVar15[uVar16 + 2 + uVar13] == '_') {
      if (((uVar5 - uVar13) - 3 == uVar16) || ((pcVar15[uVar16 + 3 + uVar13] & 0xfeU) != 0x30))
      goto LAB_00243b39;
      uVar1 = uVar13 + 2;
    }
    else {
      uVar1 = uVar13 + 1;
    }
  }
  uVar13 = uVar1;
  if ((short)uVar8 < 0) goto LAB_00243b39;
  uVar8 = sVar6 + uVar8 * 2;
  goto LAB_00243977;
LAB_00243888:
  uVar2 = uVar1;
  if (uVar7 <= uVar2) goto LAB_00243a0b;
  bVar14 = pcVar15[uVar16 + uVar2];
  bVar9 = bVar14 - 0x30;
  if (9 < bVar9) {
    if (bVar14 == 0x2e) {
      if (local_88 != 0) goto LAB_00243b39;
      uVar1 = uVar2 + 1;
      if (uVar7 <= uVar1) {
        bVar18 = uVar13 < uVar2;
        uVar2 = uVar1;
        if (bVar18) goto LAB_00243a0b;
        goto LAB_00243b39;
      }
      if ((uVar2 <= uVar13) ||
         (bVar14 = pcVar15[uVar16 + 1 + uVar2], uVar2 = uVar1, (byte)(bVar14 - 0x30) < 10))
      goto LAB_00243b39;
    }
    if ((bVar14 < 0x21) && ((0x100003e00U >> ((ulong)bVar14 & 0x3f) & 1) != 0)) {
      uVar1 = uVar2 + 1;
      uVar2 = uVar1;
      if (uVar1 < uVar7) {
        uVar2 = uVar7;
      }
      goto LAB_00243af9;
    }
    goto LAB_00243b39;
  }
  if (((ushort)~(ushort)bVar9 / 10 < uVar8) ||
     (((uVar8 = (ushort)bVar9 + uVar8 * 10, uVar1 = uVar7, ~uVar2 + uVar5 != uVar16 &&
       (uVar1 = uVar2 + 1, pcVar15[uVar16 + 1 + uVar2] == '_' && local_88 == 0)) &&
      (((uVar5 - uVar2) - 2 == uVar16 ||
       (uVar1 = uVar2 + 2, 9 < (byte)(pcVar15[uVar16 + 2 + uVar2] - 0x30U))))))) goto LAB_00243b39;
  goto LAB_00243888;
LAB_00243af9:
  if (uVar7 <= uVar1) goto LAB_00243a0b;
  if ((0x20 < (ulong)(byte)pcVar15[uVar16 + uVar1]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar16 + uVar1] & 0x3f) & 1) == 0)) goto LAB_00243b39;
  uVar1 = uVar1 + 1;
  goto LAB_00243af9;
LAB_00243a0b:
  if (uVar13 < uVar2) goto LAB_00243b22;
  goto LAB_00243b39;
LAB_002436d2:
  if (local_50 <= uVar13) goto joined_r0x00243b20;
  bVar14 = pcVar15[uVar16 + 1 + uVar13];
  bVar9 = bVar14 | 0x20;
  if (0x19 < (byte)(bVar14 + 0xbf)) {
    bVar9 = bVar14;
  }
  bVar18 = StringUtil::CharacterIsHex(bVar9);
  if (!bVar18) goto LAB_00243b39;
  cVar10 = -0x30;
  if ('`' < (char)bVar9) {
    cVar10 = -0x57;
  }
  uVar7 = local_50;
  if ((uVar5 - uVar13) - 2 != uVar16) {
    if (pcVar15[uVar16 + 2 + uVar13] == '_') {
      local_48 = uVar13;
      if (((uVar5 - uVar13) - 3 == uVar16) ||
         (bVar18 = StringUtil::CharacterIsHex(pcVar15[uVar16 + 3 + uVar13]), !bVar18))
      goto LAB_00243b39;
      uVar7 = local_48 + 2;
    }
    else {
      uVar7 = uVar13 + 1;
    }
  }
  if ((ushort)((byte)(cVar10 + bVar9) >> 4 ^ 0xfff) < uVar8) goto LAB_00243b39;
  uVar8 = uVar8 * 0x10 + (ushort)(byte)(cVar10 + bVar9);
  uVar13 = uVar7;
  goto LAB_002436d2;
joined_r0x00243b20:
  if (1 < uVar13) {
LAB_00243b22:
    *local_58 = uVar8;
    return true;
  }
  goto LAB_00243b39;
LAB_00243e78:
  uVar4 = uVar2;
  if (uVar4 < uVar7) {
    bVar14 = pcVar15[uVar16 + uVar4];
    bVar9 = bVar14 - 0x30;
    if (bVar9 < 10) goto code_r0x00243e98;
    bVar18 = uVar13 < 2;
    local_78._18_6_ = 0;
    uVar13 = uVar4;
    if (uVar4 <= uVar1 && bVar18) {
      return false;
    }
LAB_002440ad:
    uVar12 = (uint)bVar14;
    if (uVar12 - 9 < 5) {
LAB_002440bc:
      uVar5 = uVar13 + 1;
      uVar13 = uVar5;
      if (uVar5 < uVar7) {
        uVar13 = uVar7;
      }
      for (; uVar5 < uVar7; uVar5 = uVar5 + 1) {
        if (0x20 < (ulong)(byte)pcVar15[uVar16 + uVar5]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar16 + uVar5] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_00243e2e;
    }
    if ((uVar12 != 0x65) && (uVar12 != 0x45)) {
      if (uVar12 != 0x20) {
        return false;
      }
      goto LAB_002440bc;
    }
    if (uVar13 == 1 || local_88 != 0) {
      return false;
    }
    if (uVar7 <= uVar13 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar15 = pcVar15 + uVar16 + uVar13 + 1;
    iVar17 = ~uVar16 + (uVar5 - uVar13);
    if (*pcVar15 == '-') {
      bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar15,iVar17,&exponent,false);
    }
    else {
      bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar15,iVar17,&exponent,false);
    }
    if (bVar18 == false) {
      return false;
    }
    bVar18 = IntegerDecimalCastOperation::
             HandleExponent<duckdb::IntegerDecimalCastData<unsigned_short>,true>
                       (&local_78,exponent.result);
    goto joined_r0x00244127;
  }
  bVar18 = uVar13 < 2;
  local_78._18_6_ = 0;
  uVar13 = uVar4;
  if (uVar4 <= uVar1 && bVar18) {
    return false;
  }
  goto LAB_00243e2e;
code_r0x00243e98:
  uVar2 = ((ulong)bVar9 ^ 0x7ffffffffffffffe) / 10;
  lVar11 = local_78.decimal * 10 + (ulong)bVar9;
  if ((long)uVar2 < local_78.decimal) {
    lVar11 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar2);
  uVar2 = uVar7;
  local_78.decimal = lVar11;
  if ((~uVar4 + uVar5 != uVar16) && (uVar2 = uVar4 + 1, pcVar15[uVar16 + 1 + uVar4] == '_')) {
    if ((uVar5 - uVar4) - 2 == uVar16) {
      return false;
    }
    uVar2 = uVar4 + 2;
    if (9 < (byte)(pcVar15[uVar16 + 2 + uVar4] - 0x30U)) {
      return false;
    }
  }
  goto LAB_00243e78;
LAB_00243ffe:
  uVar3 = uVar4;
  if (uVar3 < uVar7) {
    bVar14 = pcVar15[uVar16 + uVar3];
    bVar9 = bVar14 - 0x30;
    if (bVar9 < 10) goto code_r0x0024401e;
    bVar18 = uVar2 <= uVar1;
    local_78._18_6_ = 0;
    uVar2 = uVar3;
    if (uVar3 <= uVar13 && bVar18) {
      return false;
    }
LAB_00244144:
    uVar12 = (uint)bVar14;
    if (uVar12 - 9 < 5) {
LAB_0024414f:
      uVar5 = uVar2 + 1;
      uVar2 = uVar5;
      if (uVar5 < uVar7) {
        uVar2 = uVar7;
      }
      for (; uVar5 < uVar7; uVar5 = uVar5 + 1) {
        if (0x20 < (ulong)(byte)pcVar15[uVar16 + uVar5]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar16 + uVar5] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_00243fb4;
    }
    if ((uVar12 != 0x65) && (uVar12 != 0x45)) {
      if (uVar12 != 0x20) {
        return false;
      }
      goto LAB_0024414f;
    }
    if (uVar2 == uVar1 || local_88 != 0) {
      return false;
    }
    if (uVar7 <= uVar2 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar15 = pcVar15 + uVar16 + uVar2 + 1;
    iVar17 = ~uVar16 + (uVar5 - uVar2);
    if (*pcVar15 == '-') {
      bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar15,iVar17,&exponent,false);
    }
    else {
      bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar15,iVar17,&exponent,false);
    }
    if (bVar18 == false) {
      return false;
    }
    bVar18 = IntegerDecimalCastOperation::
             HandleExponent<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                       (&local_78,exponent.result);
    goto joined_r0x00244127;
  }
  bVar18 = uVar2 <= uVar1;
  local_78._18_6_ = 0;
  uVar2 = uVar3;
  if (uVar3 <= uVar13 && bVar18) {
    return false;
  }
  goto LAB_00243fb4;
code_r0x0024401e:
  uVar4 = ((ulong)bVar9 ^ 0x7ffffffffffffffe) / 10;
  lVar11 = local_78.decimal * 10 + (ulong)bVar9;
  if ((long)uVar4 < local_78.decimal) {
    lVar11 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar4);
  uVar4 = uVar7;
  local_78.decimal = lVar11;
  if ((~uVar3 + uVar5 != uVar16) && (uVar4 = uVar3 + 1, pcVar15[uVar16 + 1 + uVar3] == '_')) {
    if ((uVar5 - uVar3) - 2 == uVar16) {
      return false;
    }
    uVar4 = uVar3 + 2;
    if (9 < (byte)(pcVar15[uVar16 + 2 + uVar3] - 0x30U)) {
      return false;
    }
  }
  goto LAB_00243ffe;
  while (lVar11 = uVar16 + uVar7, uVar7 = uVar7 + 1, pcVar15[lVar11] == '0') {
LAB_0024365b:
    if (uVar1 <= uVar7) {
      uVar8 = 0;
      uVar7 = 1;
      goto LAB_002437d7;
    }
  }
LAB_00243b39:
  uVar16 = 0;
  while( true ) {
    uVar7 = uVar5 - uVar16;
    if (uVar7 == 0) {
      return false;
    }
    bVar14 = pcVar15[uVar16];
    if ((0x20 < (ulong)bVar14) || ((0x100003e00U >> ((ulong)bVar14 & 0x3f) & 1) == 0)) break;
    uVar16 = uVar16 + 1;
  }
  local_78._16_8_ = 0;
  local_78.result = 0;
  local_78.decimal = 0;
  if (bVar14 == 0x2d) {
    uVar1 = 1;
    while (uVar1 < uVar7) {
      lVar11 = uVar16 + uVar1;
      uVar1 = uVar1 + 1;
      if (pcVar15[lVar11] != '0') {
        return false;
      }
    }
    local_78.result = 0;
    uVar1 = 1;
    while (uVar13 = uVar1, uVar13 < uVar7) {
      bVar14 = pcVar15[uVar16 + uVar13];
      bVar9 = bVar14 - 0x30;
      if (9 < bVar9) {
        if (bVar14 != 0x2e) goto LAB_002440ad;
        if (local_88 != 0) {
          return false;
        }
        uVar1 = uVar13 + 1;
        local_78.decimal_digits = 0;
        uVar2 = uVar1;
        local_78.decimal = 0;
        goto LAB_00243e78;
      }
      uVar1 = (0x8000000000000000 - (ulong)bVar9) / 10;
      if (SBORROW8(local_78.result,-uVar1) != (long)(local_78.result + uVar1) < 0) {
        return false;
      }
      local_78.result = local_78.result * 10 - (ulong)bVar9;
      uVar1 = uVar7;
      if ((~uVar13 + uVar5 != uVar16) &&
         (uVar1 = uVar13 + 1, pcVar15[uVar16 + 1 + uVar13] == '_' && local_88 == 0)) {
        if ((uVar5 - uVar13) - 2 == uVar16) {
          return false;
        }
        uVar1 = uVar13 + 2;
        if (9 < (byte)(pcVar15[uVar16 + 2 + uVar13] - 0x30U)) {
          return false;
        }
      }
    }
LAB_00243e2e:
    bVar18 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,true>(&local_78);
    if (!bVar18) {
      return false;
    }
    if (uVar13 < 2) {
      return false;
    }
    goto LAB_0024412d;
  }
  if ((uVar5 - 1 == uVar16) || (bVar14 != 0x30)) {
    if ((local_88 & bVar14 == 0x2b) != 0) {
      return false;
    }
    uVar1 = (ulong)(bVar14 == 0x2b);
LAB_00243d85:
    local_78.result = 0;
    uVar13 = uVar1;
    while (uVar2 = uVar13, uVar2 < uVar7) {
      bVar14 = pcVar15[uVar16 + uVar2];
      bVar9 = bVar14 - 0x30;
      if (9 < bVar9) {
        if (bVar14 != 0x2e) goto LAB_00244144;
        if (local_88 != 0) {
          return false;
        }
        uVar13 = uVar2 + 1;
        local_78.decimal_digits = 0;
        uVar4 = uVar13;
        local_78.decimal = 0;
        goto LAB_00243ffe;
      }
      if ((long)(((ulong)bVar9 ^ 0x7ffffffffffffffe) / 10) < local_78.result) {
        return false;
      }
      local_78.result = local_78.result * 10 + (ulong)bVar9;
      uVar13 = uVar7;
      if ((~uVar2 + uVar5 != uVar16) &&
         (uVar13 = uVar2 + 1, pcVar15[uVar16 + 1 + uVar2] == '_' && local_88 == 0)) {
        if ((uVar5 - uVar2) - 2 == uVar16) {
          return false;
        }
        uVar13 = uVar2 + 2;
        if (9 < (byte)(pcVar15[uVar16 + 2 + uVar2] - 0x30U)) {
          return false;
        }
      }
    }
LAB_00243fb4:
    bVar18 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>(&local_78);
    if (!bVar18) {
      return false;
    }
    if (uVar2 <= uVar1) {
      return false;
    }
    goto LAB_0024412d;
  }
  cVar10 = pcVar15[uVar16 + 1];
  if (cVar10 == 'B') {
LAB_00243f11:
    local_78.result = 0;
    uVar7 = 1;
    while (uVar7 < ~uVar16 + uVar5) {
      uVar1 = 0;
      if ((pcVar15[uVar16 + 1 + uVar7] != '0') && (uVar1 = 1, pcVar15[uVar16 + 1 + uVar7] != '1')) {
        return false;
      }
      uVar13 = ~uVar16 + uVar5;
      if ((uVar5 - uVar7) - 2 != uVar16) {
        if (pcVar15[uVar16 + 2 + uVar7] == '_') {
          if ((uVar5 - uVar7) - 3 == uVar16) {
            return false;
          }
          if ((pcVar15[uVar16 + 3 + uVar7] & 0xfeU) != 0x30) {
            return false;
          }
          uVar13 = uVar7 + 2;
        }
        else {
          uVar13 = uVar7 + 1;
        }
      }
      uVar7 = uVar13;
      if (0x3fffffffffffffff < local_78.result) {
        return false;
      }
      local_78.result = uVar1 + local_78.result * 2;
    }
    bVar18 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>(&local_78);
  }
  else {
    if (cVar10 != 'x') {
      if (cVar10 == 'b') goto LAB_00243f11;
      if (cVar10 != 'X') {
        if ((local_88 & (byte)(cVar10 - 0x30U) < 10) != 0) {
          return false;
        }
        uVar1 = 0;
        goto LAB_00243d85;
      }
    }
    lVar11 = 0;
    uVar7 = 1;
    while (uVar7 < ~uVar16 + uVar5) {
      bVar14 = pcVar15[uVar16 + 1 + uVar7];
      bVar9 = bVar14 | 0x20;
      if (0x19 < (byte)(bVar14 + 0xbf)) {
        bVar9 = bVar14;
      }
      bVar18 = StringUtil::CharacterIsHex(bVar9);
      if (!bVar18) {
        return false;
      }
      cVar10 = -0x30;
      if ('`' < (char)bVar9) {
        cVar10 = -0x57;
      }
      uVar1 = ~uVar16 + uVar5;
      if ((uVar5 - uVar7) - 2 != uVar16) {
        if (pcVar15[uVar16 + 2 + uVar7] == '_') {
          if ((uVar5 - uVar7) - 3 == uVar16) {
            return false;
          }
          bVar18 = StringUtil::CharacterIsHex(pcVar15[uVar16 + 3 + uVar7]);
          if (!bVar18) {
            return false;
          }
          uVar1 = uVar7 + 2;
        }
        else {
          uVar1 = uVar7 + 1;
        }
      }
      if ((long)((ulong)((byte)(cVar10 + bVar9) >> 4) ^ 0x7ffffffffffffff) < lVar11) {
        return false;
      }
      lVar11 = lVar11 * 0x10 + (ulong)(byte)(cVar10 + bVar9);
      uVar7 = uVar1;
    }
    local_78.result = lVar11;
    bVar18 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>(&local_78);
  }
  bVar18 = (bool)(1 < uVar7 & bVar18);
joined_r0x00244127:
  if (bVar18 == false) {
    return false;
  }
LAB_0024412d:
  *local_58 = (ushort)local_78.result;
  return true;
}

Assistant:

bool TryCast::Operation(string_t input, uint16_t &result, bool strict) {
	return TrySimpleIntegerCast<uint16_t, false>(input.GetData(), input.GetSize(), result, strict);
}